

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6InvalidcAFalseTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::
~Section6InvalidcAFalseTest2
          (Section6InvalidcAFalseTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section6InvalidcAFalseTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section6InvalidcAFalseTest2(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6InvalidcAFalseTest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "basicConstraintsCriticalcAFalseCACert",
                               "InvalidcAFalseTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "basicConstraintsCriticalcAFalseCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}